

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O1

Optional<llvm::object::SectionedAddress> * __thiscall
llvm::function_ref<llvm::Optional<llvm::object::SectionedAddress>(unsigned_int)>::
callback_fn<llvm::DWARFContext::dump(llvm::raw_ostream&,llvm::DIDumpOptions,std::array<llvm::Optional<unsigned_long>,28ul>)::__4>
          (Optional<llvm::object::SectionedAddress> *__return_storage_ptr__,
          function_ref<llvm::Optional<llvm::object::SectionedAddress>(unsigned_int)> *this,
          intptr_t callable,uint params)

{
  DWARFContext *this_00;
  uint uVar1;
  
  this_00 = *(DWARFContext **)this;
  DWARFContext::parseNormalUnits(this_00);
  uVar1 = (this_00->NormalUnits).NumInfoUnits;
  if (uVar1 == 0xffffffff) {
    uVar1 = (this_00->NormalUnits).
            super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
            .
            super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
            .
            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
            .
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            .super_SmallVectorBase.Size;
  }
  if (uVar1 == 0) {
    (__return_storage_ptr__->Storage).field_0.empty = '\0';
    (__return_storage_ptr__->Storage).hasVal = false;
  }
  else {
    DWARFUnit::getAddrOffsetSectionItem
              (__return_storage_ptr__,
               *(this_00->NormalUnits).
                super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                .
                super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
                .
                super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                .
                super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                .super_SmallVectorBase.BeginX,(uint32_t)callable);
  }
  return __return_storage_ptr__;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params ...params) {
    return (*reinterpret_cast<Callable*>(callable))(
        std::forward<Params>(params)...);
  }